

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_48 [32];
  
  *(undefined ***)this = &PTR__NotImplementedException_0016bb08;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  (this->m_what)._M_string_length = 0;
  (this->m_what).field_2._M_local_buf[0] = '\0';
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,lineInfo);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  operator<<((ostream *)local_1c0,lineInfo);
  std::operator<<((ostream *)local_1c0,": function ");
  std::operator<<((ostream *)local_1c0,"not implemented");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_what,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( SourceLineInfo const& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << ": function ";
        oss << "not implemented";
        m_what = oss.str();
    }